

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

QRectF * __thiscall
QWidgetWindowPrivate::closestAcceptableGeometry
          (QRectF *__return_storage_ptr__,QWidgetWindowPrivate *this,QRectF *rect)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QWidget *widget;
  QWidgetData *pQVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  qreal qVar10;
  qreal qVar11;
  char cVar12;
  QSize QVar13;
  long in_FS_OFFSET;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  qreal qVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(*(long *)&this->field_0x8 + 0x28);
  if ((((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) ||
      (widget = *(QWidget **)(*(long *)&this->field_0x8 + 0x30), widget == (QWidget *)0x0)) ||
     ((((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 ||
      (cVar12 = (**(code **)(*(long *)widget + 0x88))(widget), cVar12 == '\0')))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      return __return_storage_ptr__;
    }
  }
  else {
    dVar19 = (double)((ulong)rect->w & 0x8000000000000000 | 0x3fe0000000000000) + rect->w;
    bVar6 = 2147483647.0 < dVar19;
    if (dVar19 <= -2147483648.0) {
      dVar19 = -2147483648.0;
    }
    local_30.wd.m_i =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar19);
    dVar19 = (double)((ulong)rect->h & 0x8000000000000000 | 0x3fe0000000000000) + rect->h;
    bVar6 = 2147483647.0 < dVar19;
    if (dVar19 <= -2147483648.0) {
      dVar19 = -2147483648.0;
    }
    local_30.ht.m_i =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar19);
    QVar13 = QLayout::closestAcceptableSize(widget,&local_30);
    if (QVar13.ht.m_i.m_i == local_30.ht.m_i && QVar13.wd.m_i.m_i == local_30.wd.m_i) {
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
    }
    else {
      qVar18 = rect->xp;
      qVar10 = rect->yp;
      qVar11 = rect->h;
      __return_storage_ptr__->w = rect->w;
      __return_storage_ptr__->h = qVar11;
      __return_storage_ptr__->xp = qVar18;
      __return_storage_ptr__->yp = qVar10;
      pQVar5 = widget->data;
      iVar1 = (pQVar5->crect).x1.m_i;
      dVar16 = (double)iVar1;
      iVar2 = (pQVar5->crect).y1.m_i;
      dVar23 = (double)iVar2;
      iVar3 = (pQVar5->crect).x2.m_i;
      dVar19 = __return_storage_ptr__->yp;
      dVar20 = dVar19 + __return_storage_ptr__->h;
      dVar22 = dVar19 - dVar23;
      dVar23 = dVar20 - ((double)(((long)(pQVar5->crect).y2.m_i - (long)iVar2) + 1) + dVar23);
      uVar14 = -(ulong)(dVar22 < -dVar22);
      uVar15 = -(ulong)(dVar23 < -dVar23);
      uVar9 = (ulong)-dVar23 & uVar15;
      auVar21._0_8_ = ~uVar14 & (ulong)dVar22;
      auVar21._8_8_ = ~uVar15 & (ulong)dVar23;
      auVar8._8_4_ = (int)uVar9;
      auVar8._0_8_ = (ulong)-dVar22 & uVar14;
      auVar8._12_4_ = (int)(uVar9 >> 0x20);
      dVar23 = (double)(QVar13.ht.m_i.m_i - local_30.ht.m_i);
      if (SUB168(auVar21 | auVar8,0) <= SUB168(auVar21 | auVar8,8)) {
        qVar18 = (dVar20 + dVar23) - dVar19;
      }
      else {
        dVar23 = (dVar19 - dVar23) - dVar19;
        __return_storage_ptr__->yp = dVar19 + dVar23;
        qVar18 = __return_storage_ptr__->h - dVar23;
      }
      __return_storage_ptr__->h = qVar18;
      dVar19 = __return_storage_ptr__->xp;
      dVar20 = dVar19 + __return_storage_ptr__->w;
      dVar23 = dVar19 - dVar16;
      dVar16 = dVar20 - ((double)(((long)iVar3 - (long)iVar1) + 1) + dVar16);
      uVar14 = -(ulong)(dVar23 < -dVar23);
      uVar15 = -(ulong)(dVar16 < -dVar16);
      uVar9 = (ulong)-dVar16 & uVar15;
      auVar17._0_8_ = ~uVar14 & (ulong)dVar23;
      auVar17._8_8_ = ~uVar15 & (ulong)dVar16;
      auVar7._8_4_ = (int)uVar9;
      auVar7._0_8_ = (ulong)-dVar23 & uVar14;
      auVar7._12_4_ = (int)(uVar9 >> 0x20);
      dVar16 = (double)(QVar13.wd.m_i.m_i - local_30.wd.m_i);
      if (SUB168(auVar17 | auVar7,0) <= SUB168(auVar17 | auVar7,8)) {
        __return_storage_ptr__->w = (dVar20 + dVar16) - dVar19;
      }
      else {
        dVar16 = (dVar19 - dVar16) - dVar19;
        __return_storage_ptr__->xp = dVar19 + dVar16;
        __return_storage_ptr__->w = __return_storage_ptr__->w - dVar16;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetWindowPrivate::closestAcceptableGeometry(const QRectF &rect) const
{
    Q_Q(const QWidgetWindow);
    const QWidget *widget = q->widget();
    if (!widget || !widget->isWindow() || !widget->hasHeightForWidth())
        return QRect();
    const QSize oldSize = rect.size().toSize();
    const QSize newSize = QLayout::closestAcceptableSize(widget, oldSize);
    if (newSize == oldSize)
        return QRectF();
    const int dw = newSize.width() - oldSize.width();
    const int dh = newSize.height() - oldSize.height();
    QRectF result = rect;
    const QRectF currentGeometry(widget->geometry());
    const qreal topOffset = result.top() - currentGeometry.top();
    const qreal bottomOffset = result.bottom() - currentGeometry.bottom();
    if (qAbs(topOffset) > qAbs(bottomOffset))
        result.setTop(result.top() - dh); // top edge drag
    else
        result.setBottom(result.bottom() + dh); // bottom edge drag
    const qreal leftOffset = result.left() - currentGeometry.left();
    const qreal rightOffset = result.right() - currentGeometry.right();
    if (qAbs(leftOffset) > qAbs(rightOffset))
        result.setLeft(result.left() - dw); // left edge drag
    else
        result.setRight(result.right() + dw); // right edge drag
    return result;
}